

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

char * kj::_::anon_unknown_1::FloatToBuffer(float value,char *buffer)

{
  bool bVar1;
  float fVar2;
  Fault local_50;
  Fault f_1;
  float local_40;
  int snprintf_result2;
  float parsed_value;
  Fault local_30;
  Fault f;
  int snprintf_result;
  char *buffer_local;
  float value_local;
  
  fVar2 = inf();
  if ((value != fVar2) || (NAN(value) || NAN(fVar2))) {
    fVar2 = inf();
    if ((value != -fVar2) || (NAN(value) || NAN(-fVar2))) {
      bVar1 = IsNaN((double)value);
      if (bVar1) {
        strcpy(buffer,"nan");
      }
      else {
        f.exception._4_4_ = snprintf(buffer,0x18,"%.*g",(double)value);
        if (f.exception._4_4_ < 1 || 0x17 < f.exception._4_4_) {
          Debug::Fault::Fault(&local_30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                              ,0x1d5,FAILED,
                              "snprintf_result > 0 && snprintf_result < kFloatToBufferSize","");
          Debug::Fault::fatal(&local_30);
        }
        bVar1 = safe_strtof(buffer,&local_40);
        if ((((!bVar1) || (local_40 != value)) || (NAN(local_40) || NAN(value))) &&
           (f_1.exception._4_4_ = snprintf(buffer,0x18,"%.*g",(double)value),
           f_1.exception._4_4_ < 1 || 0x17 < f_1.exception._4_4_)) {
          Debug::Fault::Fault(&local_50,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                              ,0x1dd,FAILED,
                              "snprintf_result2 > 0 && snprintf_result2 < kFloatToBufferSize","");
          Debug::Fault::fatal(&local_50);
        }
        DelocalizeRadix(buffer);
        RemovePlus(buffer);
      }
    }
    else {
      strcpy(buffer,"-inf");
    }
  }
  else {
    strcpy(buffer,"inf");
  }
  return buffer;
}

Assistant:

char* FloatToBuffer(float value, char* buffer) {
  // FLT_DIG is 6 for IEEE-754 floats, which are used on almost all
  // platforms these days.  Just in case some system exists where FLT_DIG
  // is significantly larger -- and risks overflowing our buffer -- we have
  // this assert.
  static_assert(FLT_DIG < 10, "FLT_DIG is too big");

  if (value == inf()) {
    strcpy(buffer, "inf");
    return buffer;
  } else if (value == -inf()) {
    strcpy(buffer, "-inf");
    return buffer;
  } else if (IsNaN(value)) {
    strcpy(buffer, "nan");
    return buffer;
  }

  int snprintf_result KJ_UNUSED =
    snprintf(buffer, kFloatToBufferSize, "%.*g", FLT_DIG, value);

  // The snprintf should never overflow because the buffer is significantly
  // larger than the precision we asked for.
  KJ_DASSERT(snprintf_result > 0 && snprintf_result < kFloatToBufferSize);

  float parsed_value;
  if (!safe_strtof(buffer, &parsed_value) || parsed_value != value) {
    int snprintf_result2 KJ_UNUSED =
      snprintf(buffer, kFloatToBufferSize, "%.*g", FLT_DIG+2, value);

    // Should never overflow; see above.
    KJ_DASSERT(snprintf_result2 > 0 && snprintf_result2 < kFloatToBufferSize);
  }

  DelocalizeRadix(buffer);
  RemovePlus(buffer);
#if _WIN32
  RemoveE0(buffer);
#endif // _WIN32
  return buffer;
}